

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_listener.cpp
# Opt level: O1

void __thiscall
chatter::PacketLoggerConsole::on_recv
          (PacketLoggerConsole *this,uint64_t ts,PacketStats *packet_stats,PeerStats *peer_stats)

{
  ostream *poVar1;
  char *this_00;
  string local_40;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  this_00 = " RECV<<<  ";
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," RECV<<<  ",10);
  PacketListener::debug_string_abi_cxx11_
            (&local_40,(PacketListener *)this_00,packet_stats,peer_stats);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PacketLoggerConsole::on_recv(uint64_t ts, const PacketStats& packet_stats, const PeerStats& peer_stats)
{
    std::cout << ts << " RECV<<<  " << debug_string(packet_stats, peer_stats) << std::endl;
}